

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.hpp
# Opt level: O1

shared_ptr<helics::Broker> __thiscall
helics::BrokerFactory::
BrokerTypeBuilder<helics::NetworkBroker<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1,_7>_>
::build(BrokerTypeBuilder<helics::NetworkBroker<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1,_7>_>
        *this,string_view name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::Broker> sVar1;
  undefined1 local_39;
  BrokerBuilder local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = (size_t)name._M_str;
  local_38._vptr_BrokerBuilder = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::NetworkBroker<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1,7>,std::allocator<helics::NetworkBroker<helics::udp::UdpComms,(gmlc::networking::InterfaceTypes)1,7>>,std::basic_string_view<char,std::char_traits<char>>&>
            (&_Stack_30,
             (NetworkBroker<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1,_7> **)
             &local_38,
             (allocator<helics::NetworkBroker<helics::udp::UdpComms,_(gmlc::networking::InterfaceTypes)1,_7>_>
              *)&local_39,&local_28);
  this[1].super_BrokerBuilder._vptr_BrokerBuilder = (_func_int **)0x0;
  (this->super_BrokerBuilder)._vptr_BrokerBuilder = local_38._vptr_BrokerBuilder;
  this[1].super_BrokerBuilder._vptr_BrokerBuilder = (_func_int **)_Stack_30._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<helics::Broker>)
         sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Broker> build(std::string_view name) override
        {
            return std::make_shared<BrokerTYPE>(name);
        }